

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,uint128 *value)

{
  ostringstream str;
  long *local_1b0;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  protobuf::operator<<((ostream *)local_190,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->message_,(ulong)local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const uint128& value) {
  std::ostringstream str;
  str << value;
  message_ += str.str();
  return *this;
}